

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int delta_encode_cost(int *colors,int num,int bit_depth,int min_val)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int deltas [8];
  
  if (num < 1) {
    bit_depth = 0;
  }
  else if (num != 1) {
    iVar3 = 0;
    for (lVar7 = 0; (ulong)(uint)num - 1 != lVar7; lVar7 = lVar7 + 1) {
      iVar8 = colors[lVar7 + 1] - colors[lVar7];
      deltas[lVar7] = iVar8;
      if (iVar3 < iVar8) {
        iVar3 = iVar8;
      }
    }
    uVar4 = iVar3 - min_val;
    uVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = (uVar1 ^ 0xffffffe0) + 0x21;
    if ((int)(uVar4 + 1) < 2) {
      iVar3 = 0;
    }
    if (iVar3 <= bit_depth + -3) {
      iVar3 = bit_depth + -3;
    }
    bVar2 = (byte)bit_depth;
    bit_depth = bit_depth + 2;
    iVar8 = (1 << (bVar2 & 0x1f)) - (min_val + *colors);
    for (uVar5 = 0; num - 1 != uVar5; uVar5 = uVar5 + 1) {
      iVar8 = iVar8 - deltas[uVar5];
      bit_depth = bit_depth + iVar3;
      uVar1 = 0x1f;
      if (iVar8 - 1U != 0) {
        for (; iVar8 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar6 = (uVar1 ^ 0xffffffe0) + 0x21;
      if (iVar8 < 2) {
        iVar6 = 0;
      }
      if (iVar6 <= iVar3) {
        iVar3 = iVar6;
      }
    }
  }
  return bit_depth;
}

Assistant:

static int delta_encode_cost(const int *colors, int num, int bit_depth,
                             int min_val) {
  if (num <= 0) return 0;
  int bits_cost = bit_depth;
  if (num == 1) return bits_cost;
  bits_cost += 2;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  const int min_bits = bit_depth - 3;
  for (int i = 1; i < num; ++i) {
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  int bits_per_delta = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits_per_delta <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  for (int i = 0; i < num - 1; ++i) {
    bits_cost += bits_per_delta;
    range -= deltas[i];
    bits_per_delta = AOMMIN(bits_per_delta, av1_ceil_log2(range));
  }
  return bits_cost;
}